

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void Intra4Preds_SSE2(uint8_t *dst,uint8_t *top)

{
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  uint8_t *unaff_retaddr;
  uint8_t *in_stack_00000050;
  uint8_t *in_stack_00000058;
  uint8_t *in_stack_00000070;
  uint8_t *in_stack_00000078;
  uint8_t *in_stack_00000090;
  uint8_t *in_stack_00000098;
  uint8_t *in_stack_000000c0;
  uint8_t *in_stack_000000c8;
  uint8_t *in_stack_ffffffffffffffe8;
  
  DC4_SSE2(in_RSI,in_stack_ffffffffffffffe8);
  TM4_SSE2(in_stack_00000058,in_stack_00000050);
  VE4_SSE2(in_stack_00000078,in_stack_00000070);
  HE4_SSE2(unaff_retaddr,in_RDI);
  RD4_SSE2(in_stack_00000078,in_stack_00000070);
  VR4_SSE2(in_stack_00000098,in_stack_00000090);
  LD4_SSE2(in_stack_00000078,in_stack_00000070);
  VL4_SSE2(in_stack_000000c8,in_stack_000000c0);
  HD4_SSE2(in_RDI + 0x680,in_RSI);
  HU4_SSE2(in_RDI + 0x684,in_RSI);
  return;
}

Assistant:

static void Intra4Preds_SSE2(uint8_t* WEBP_RESTRICT dst,
                             const uint8_t* WEBP_RESTRICT top) {
  DC4_SSE2(I4DC4 + dst, top);
  TM4_SSE2(I4TM4 + dst, top);
  VE4_SSE2(I4VE4 + dst, top);
  HE4_SSE2(I4HE4 + dst, top);
  RD4_SSE2(I4RD4 + dst, top);
  VR4_SSE2(I4VR4 + dst, top);
  LD4_SSE2(I4LD4 + dst, top);
  VL4_SSE2(I4VL4 + dst, top);
  HD4_SSE2(I4HD4 + dst, top);
  HU4_SSE2(I4HU4 + dst, top);
}